

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O0

int Gia_ManMuxProfile(Mux_Man_t *p,int fWidth)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  char *pcVar4;
  Vec_Int_t *vCounts;
  Vec_Int_t *vVec;
  int local_28;
  int Total;
  int Counter;
  int Entry;
  int i;
  int fWidth_local;
  Mux_Man_t *p_local;
  
  p_00 = Vec_IntStart(1000);
  if (fWidth == 0) {
    for (Counter = 1; iVar1 = Vec_WecSize(p->vTops), Counter < iVar1; Counter = Counter + 1) {
      pcVar4 = Abc_NamStr(p->pNames,Counter);
      iVar1 = atoi(pcVar4);
      iVar1 = Abc_MinInt(iVar1,999);
      Vec_IntAddToEntry(p_00,iVar1,1);
    }
  }
  else {
    for (Counter = 1; iVar1 = Vec_WecSize(p->vTops), Counter < iVar1; Counter = Counter + 1) {
      p_01 = Vec_WecEntry(p->vTops,Counter);
      iVar1 = Vec_IntSize(p_01);
      iVar1 = Abc_MinInt(iVar1,999);
      Vec_IntAddToEntry(p_00,iVar1,1);
    }
  }
  iVar1 = Vec_IntCountPositive(p_00);
  if (iVar1 == 0) {
    p_local._4_4_ = 0;
  }
  else {
    pcVar4 = "sizes";
    if (fWidth != 0) {
      pcVar4 = "widths";
    }
    printf("The distribution of MUX tree %s:\n",pcVar4);
    local_28 = 0;
    for (Counter = 0; iVar2 = Vec_IntSize(p_00), Counter < iVar2; Counter = Counter + 1) {
      uVar3 = Vec_IntEntry(p_00,Counter);
      if (uVar3 != 0) {
        local_28 = local_28 + 1;
        if (local_28 == 0xc) {
          printf("\n");
          local_28 = 0;
        }
        printf("  %d=%d",(ulong)(uint)Counter,(ulong)uVar3);
      }
    }
    printf("\nSummary: ");
    uVar3 = Vec_IntFindMax(p_00);
    printf("Max = %d  ",(ulong)uVar3);
    iVar2 = Vec_IntSum(p_00);
    printf("Ave = %.2f",((double)iVar2 * 1.0) / (double)iVar1);
    printf("\n");
    Vec_IntFree(p_00);
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManMuxProfile( Mux_Man_t * p, int fWidth )
{
    int i, Entry, Counter, Total;
    Vec_Int_t * vVec, * vCounts;
    vCounts = Vec_IntStart( 1000 );
    if ( fWidth )
    {
        Vec_WecForEachLevelStart( p->vTops, vVec, i, 1 )
            Vec_IntAddToEntry( vCounts, Abc_MinInt(Vec_IntSize(vVec), 999), 1 );
    }
    else
    {
        for ( i = 1; i < Vec_WecSize(p->vTops); i++ )
            Vec_IntAddToEntry( vCounts, Abc_MinInt(atoi(Abc_NamStr(p->pNames, i)), 999), 1 );
    }
    Total = Vec_IntCountPositive(vCounts);
    if ( Total == 0 )
        return 0;
    printf( "The distribution of MUX tree %s:\n", fWidth ? "widths" : "sizes"  );
    Counter = 0;
    Vec_IntForEachEntry( vCounts, Entry, i )
    {
        if ( !Entry ) continue;
        if ( ++Counter == 12 )
            printf( "\n" ), Counter = 0;
        printf( "  %d=%d", i, Entry );
    }
    printf( "\nSummary: " );
    printf( "Max = %d  ", Vec_IntFindMax(vCounts) );
    printf( "Ave = %.2f", 1.0*Vec_IntSum(vCounts)/Total );
    printf( "\n" );
    Vec_IntFree( vCounts );
    return 1;
}